

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x12_conv.cpp
# Opt level: O2

precise_unit units::dod_unit(string *dod_string)

{
  char *__s2;
  int iVar1;
  double dVar2;
  difference_type __d;
  ulong uVar3;
  undefined1 *puVar4;
  ulong uVar5;
  double dVar6;
  precise_unit pVar7;
  
  __s2 = (dod_string->_M_dataplus)._M_p;
  puVar4 = dod_units;
  uVar3 = 0x1e6;
  while (uVar5 = uVar3, 0 < (long)uVar5) {
    uVar3 = uVar5 >> 1;
    iVar1 = strcmp(*(char **)((long)puVar4 + (uVar3 * 4 + 3) * 8),__s2);
    if (iVar1 < 0) {
      puVar4 = (undefined1 *)((long)puVar4 + (uVar3 * 4 + 4) * 8);
      uVar3 = ~uVar3 + uVar5;
    }
  }
  iVar1 = strcmp(*(char **)((long)puVar4 + 0x18),__s2);
  if (iVar1 == 0) {
    dVar6 = *(double *)puVar4;
    dVar2 = *(double *)((long)puVar4 + 8);
  }
  else {
    dVar2 = 2.07707442941207e-314;
    dVar6 = 1.0;
  }
  pVar7._8_8_ = dVar2;
  pVar7.multiplier_ = dVar6;
  return pVar7;
}

Assistant:

precise_unit dod_unit(const std::string& dod_string)
{
    // NOLINTNEXTLINE (readability-qualified-auto)
    auto ind = std::lower_bound(
        dod_units.begin(),
        dod_units.end(),
        dod_string,
        [](const unitD& u_set, const std::string& val) {
            return (strcmp(std::get<0>(u_set), val.c_str()) < 0);
        });
    if (strcmp(std::get<0>(*ind), dod_string.c_str()) == 0) {
        return std::get<2>(*ind);
    }
    return precise::error;
}